

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

string * __thiscall
prometheus::Gateway::getUri
          (string *__return_storage_ptr__,Gateway *this,CollectableEntry *collectable)

{
  ostream *poVar1;
  stringstream uri;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->jobUri_)._M_dataplus._M_p,(this->jobUri_)._M_string_length);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->labels_)._M_dataplus._M_p,(this->labels_)._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(collectable->second)._M_dataplus._M_p,(collectable->second)._M_string_length);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Gateway::getUri(const CollectableEntry& collectable) const {
  std::stringstream uri;
  uri << jobUri_ << labels_ << collectable.second;

  return uri.str();
}